

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O2

void YM2612_Reset(ym2612_ *YM2612)

{
  channel__ *pcVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  
  YM2612->DAC = '\0';
  YM2612->DACdata = 0;
  YM2612->dac_highpass = 0;
  YM2612->Inter_Cnt = 0;
  YM2612->Status = 0;
  YM2612->OPNAadr = 0;
  YM2612->OPNBadr = 0;
  YM2612->LFOcnt = 0;
  YM2612->TimerA = 0;
  YM2612->TimerAL = 0;
  YM2612->TimerAcnt = 0;
  YM2612->TimerB = 0;
  YM2612->TimerBL = 0;
  YM2612->TimerBcnt = 0;
  piVar2 = &YM2612->CHANNEL[0].SLOT[0].ChgEnM;
  piVar3 = YM2612->CHANNEL[0].KC;
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    pcVar1 = YM2612->CHANNEL + lVar4;
    pcVar1->Old_OUTd = 0;
    pcVar1->OUTd = 0;
    *(undefined8 *)(&pcVar1->Old_OUTd + 2) = 0xffffffffffffffff;
    pcVar1 = YM2612->CHANNEL + lVar4;
    pcVar1->ALGO = 0;
    pcVar1->FB = 0x1f;
    *(undefined8 *)(&pcVar1->ALGO + 2) = 0;
    piVar5 = piVar2;
    for (lVar6 = -0x10; lVar6 != 0; lVar6 = lVar6 + 4) {
      *(undefined4 *)((long)piVar3 + lVar6 + -0x40) = 0;
      *(undefined4 *)((long)piVar3 + lVar6 + -0x10) = 0;
      *(undefined4 *)((long)piVar3 + lVar6) = 0;
      *(undefined4 *)((long)piVar3 + lVar6 + 0x10) = 0;
      ((slot__ *)(piVar5 + -0x1f))->DT = YM2612->DT_TAB[0];
      *(undefined8 *)(piVar5 + -9) = 0;
      *(undefined8 *)(piVar5 + -0xd) = 0;
      *(undefined8 *)(piVar5 + -0xb) = 0x2000000000000003;
      *piVar5 = 0;
      piVar5 = piVar5 + 0x22;
    }
    piVar2 = piVar2 + 0xa2;
    piVar3 = piVar3 + 0xa2;
  }
  for (lVar4 = 0x1090; lVar4 != 0x1190; lVar4 = lVar4 + 1) {
    *(undefined1 *)((long)YM2612 + lVar4 + -0x100) = 0xff;
    *(undefined1 *)((long)YM2612->CHANNEL[0].S0_OUT + lVar4 + -0x60) = 0xff;
  }
  for (uVar7 = 0xb6; 0xb3 < uVar7; uVar7 = uVar7 - 1) {
    YM2612->OPNAadr = uVar7;
    YM2612_Write(YM2612,'\x01',0xc0);
    YM2612->OPNBadr = uVar7;
    YM2612_Write(YM2612,'\x03',0xc0);
  }
  for (uVar7 = 0xb2; 0x21 < uVar7; uVar7 = uVar7 - 1) {
    YM2612->OPNAadr = uVar7;
    YM2612_Write(YM2612,'\x01','\0');
    YM2612->OPNBadr = uVar7;
    YM2612_Write(YM2612,'\x03','\0');
  }
  YM2612->OPNAadr = 0x2a;
  YM2612_Write(YM2612,'\x01',0x80);
  return;
}

Assistant:

void YM2612_Reset(ym2612_ *YM2612)
{
  int i, j;

#if YM_DEBUG_LEVEL > 0
  fprintf(debug_file, "\n\nStarting reseting YM2612 ...\n\n");
#endif

  YM2612->LFOcnt = 0;
  YM2612->TimerA = 0;
  YM2612->TimerAL = 0;
  YM2612->TimerAcnt = 0;
  YM2612->TimerB = 0;
  YM2612->TimerBL = 0;
  YM2612->TimerBcnt = 0;
  YM2612->DAC = 0;
  YM2612->DACdata = 0;
  YM2612->dac_highpass = 0;

  YM2612->Status = 0;

  YM2612->OPNAadr = 0;
  YM2612->OPNBadr = 0;
  YM2612->Inter_Cnt = 0;

  for (i = 0; i < 6; i++)
  {
    YM2612->CHANNEL[i].Old_OUTd = 0;
    YM2612->CHANNEL[i].OUTd = 0;
    YM2612->CHANNEL[i].LEFT = 0xFFFFFFFF;
    YM2612->CHANNEL[i].RIGHT = 0xFFFFFFFF;
    YM2612->CHANNEL[i].ALGO = 0;
    YM2612->CHANNEL[i].FB = 31;
    YM2612->CHANNEL[i].FMS = 0;
    YM2612->CHANNEL[i].AMS = 0;

    for (j = 0 ;j < 4 ; j++)
    {
      YM2612->CHANNEL[i].S0_OUT[j] = 0;
      YM2612->CHANNEL[i].FNUM[j] = 0;
      YM2612->CHANNEL[i].FOCT[j] = 0;
      YM2612->CHANNEL[i].KC[j] = 0;

      YM2612->CHANNEL[i].SLOT[j].DT = YM2612->DT_TAB[0];
      YM2612->CHANNEL[i].SLOT[j].Fcnt = 0;
      YM2612->CHANNEL[i].SLOT[j].Finc = 0;
      YM2612->CHANNEL[i].SLOT[j].Ecnt = ENV_END;    // Put it at the end of Decay phase...
      YM2612->CHANNEL[i].SLOT[j].Einc = 0;
      YM2612->CHANNEL[i].SLOT[j].Ecmp = 0;
      YM2612->CHANNEL[i].SLOT[j].Ecurp = RELEASE;

      YM2612->CHANNEL[i].SLOT[j].ChgEnM = 0;
    }
  }

  for (i = 0; i < 0x100; i++)
  {
    YM2612->REG[0][i] = 0xFF;
    YM2612->REG[1][i] = 0xFF;
  }

  for (i = 0xB6; i >= 0xB4; i--)
  {
    YM2612_Write(YM2612, 0, (UINT8) i);
    YM2612_Write(YM2612, 1, 0xC0);
    YM2612_Write(YM2612, 2, (UINT8) i);
    YM2612_Write(YM2612, 3, 0xC0);
  }

  for (i = 0xB2; i >= 0x22; i--)
  {
    YM2612_Write(YM2612, 0, (UINT8) i);
    YM2612_Write(YM2612, 1, 0);
    YM2612_Write(YM2612, 2, (UINT8) i);
    YM2612_Write(YM2612, 3, 0);
  }

  YM2612_Write(YM2612, 0, 0x2A);
  YM2612_Write(YM2612, 1, 0x80);

#if YM_DEBUG_LEVEL > 0
  fprintf(debug_file, "\n\nFinishing reseting YM2612 ...\n\n");
#endif

  return;
}